

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_concave_hull.cpp
# Opt level: O0

void empty_invoker(void)

{
  undefined8 uVar1;
  basic_wrap_stringstream<char> *pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char local_8e1;
  basic_wrap_stringstream<char> local_8e0;
  basic_cstring<const_char> local_748;
  basic_cstring<const_char> local_738;
  char local_721;
  basic_wrap_stringstream<char> local_720;
  basic_cstring<const_char> local_588;
  basic_cstring<const_char> local_578;
  char local_561;
  basic_wrap_stringstream<char> local_560;
  basic_cstring<const_char> local_3c8;
  basic_cstring<const_char> local_3b8;
  char local_3a1;
  basic_wrap_stringstream<char> local_3a0;
  basic_cstring<const_char> local_208;
  basic_cstring<const_char> local_1f8;
  undefined1 local_1e8 [8];
  empty t;
  basic_wrap_stringstream<char> local_1c0;
  basic_cstring<const_char> local_28;
  basic_cstring<const_char> local_18;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jeremy-murphy[P]concave_hull/test_concave_hull.cpp"
             ,0x69);
  memset(&local_1c0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_1c0);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_1c0);
  t.super_ConcaveHull.input.
  super_vector<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
  .
  super__Vector_base<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ = 0x22;
  pbVar2 = boost::operator<<(pbVar2,(char *)((long)&t.super_ConcaveHull.input.
                                                                                                        
                                                  super_vector<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
                                                  .
                                                  super__Vector_base<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>,_std::allocator<boost::geometry::model::point<double,_2UL,_boost::geometry::cs::cartesian>_>_>
                                                  ._M_impl.super__Vector_impl_data + 0x13));
  pbVar2 = boost::operator<<(pbVar2,(char (*) [6])"empty");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture ctor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_28,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_18,0x22,&local_28);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_1c0);
  empty::empty((empty *)local_1e8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_1f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jeremy-murphy[P]concave_hull/test_concave_hull.cpp"
             ,0x69);
  memset(&local_3a0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_3a0);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_3a0);
  local_3a1 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_3a1);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [6])"empty");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [16])"\" fixture setup");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_208,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1f8,0x22,&local_208);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_3a0);
  boost::unit_test::setup_conditional<empty>((empty *)local_1e8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_3b8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jeremy-murphy[P]concave_hull/test_concave_hull.cpp"
             ,0x69);
  memset(&local_560,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_560);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_560);
  local_561 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_561);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [6])"empty");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [13])"\" test entry");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3c8,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3b8,0x22,&local_3c8);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_560);
  empty::test_method((empty *)local_1e8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_578,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jeremy-murphy[P]concave_hull/test_concave_hull.cpp"
             ,0x69);
  memset(&local_720,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_720);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_720);
  local_721 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_721);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [6])"empty");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [19])"\" fixture teardown");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_588,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_578,0x22,&local_588);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_720);
  boost::unit_test::teardown_conditional<empty>((empty *)local_1e8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
            (&local_738,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jeremy-murphy[P]concave_hull/test_concave_hull.cpp"
             ,0x69);
  memset(&local_8e0,0,0x198);
  boost::basic_wrap_stringstream<char>::basic_wrap_stringstream(&local_8e0);
  pbVar2 = boost::basic_wrap_stringstream<char>::ref(&local_8e0);
  local_8e1 = '\"';
  pbVar2 = boost::operator<<(pbVar2,&local_8e1);
  pbVar2 = boost::operator<<(pbVar2,(char (*) [6])"empty");
  pbVar2 = boost::operator<<(pbVar2,(char (*) [15])"\" fixture dtor");
  pbVar3 = boost::basic_wrap_stringstream<char>::str_abi_cxx11_(pbVar2);
  boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_748,pbVar3);
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_738,0x22,&local_748);
  boost::basic_wrap_stringstream<char>::~basic_wrap_stringstream(&local_8e0);
  empty::~empty((empty *)local_1e8);
  return;
}

Assistant:

BOOST_FIXTURE_TEST_CASE(empty, ConcaveHull)
{
    Ring hull = list_of(Point(0, 0))(Point(0, 1))(Point(1, 1))(Point(1, 0)), hull_copy(hull);
    concave_hull(input, 0, hull);
    BOOST_CHECK(equals(hull, hull_copy));
}